

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O2

int32_t ulocimp_getCountry_63(char *localeID,char *country,int32_t countryCapacity,char **pEnd)

{
  byte c;
  char cVar1;
  ushort uVar2;
  uint in_EAX;
  uint uVar3;
  uint uVar4;
  int32_t i;
  ulong uVar5;
  ulong uVar6;
  char cnty [4];
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  uVar6 = 0;
  while( true ) {
    c = localeID[uVar6];
    if (((c - 0x2d < 0x33) && ((0x4000000080003U >> ((ulong)(c - 0x2d) & 0x3f) & 1) != 0)) ||
       (c == 0)) break;
    if (uVar6 < 3) {
      cVar1 = uprv_toupper_63(c);
      *(char *)((long)&uStack_38 + uVar6 + 4) = cVar1;
    }
    uVar6 = uVar6 + 1;
  }
  uVar3 = (uint)uVar6;
  uVar4 = 0;
  if ((uVar3 & 0x7ffffffe) == 2) {
    if ((uVar6 == 3) &&
       (uVar2 = _findIndex(COUNTRIES_3,(char *)((long)&uStack_38 + 4)), -1 < (short)uVar2)) {
      uVar3 = _copyCount(country,countryCapacity,COUNTRIES[uVar2]);
    }
    else {
      for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        if ((long)uVar5 < (long)countryCapacity) {
          cVar1 = uprv_toupper_63(localeID[uVar5]);
          country[uVar5] = cVar1;
        }
      }
    }
    localeID = localeID + (int)uVar3;
    uVar4 = uVar3;
  }
  if (pEnd != (char **)0x0) {
    *pEnd = localeID;
  }
  return uVar4;
}

Assistant:

U_CFUNC int32_t
ulocimp_getCountry(const char *localeID,
                   char *country, int32_t countryCapacity,
                   const char **pEnd)
{
    int32_t idLen=0;
    char cnty[ULOC_COUNTRY_CAPACITY]={ 0, 0, 0, 0 };
    int32_t offset;

    /* copy the country as far as possible and count its length */
    while(!_isTerminator(localeID[idLen]) && !_isIDSeparator(localeID[idLen])) {
        if(idLen<(ULOC_COUNTRY_CAPACITY-1)) {   /*CWB*/
            cnty[idLen]=(char)uprv_toupper(localeID[idLen]);
        }
        idLen++;
    }

    /* the country should be either length 2 or 3 */
    if (idLen == 2 || idLen == 3) {
        UBool gotCountry = FALSE;
        /* convert 3 character code to 2 character code if possible *CWB*/
        if(idLen==3) {
            offset=_findIndex(COUNTRIES_3, cnty);
            if(offset>=0) {
                idLen=_copyCount(country, countryCapacity, COUNTRIES[offset]);
                gotCountry = TRUE;
            }
        }
        if (!gotCountry) {
            int32_t i = 0;
            for (i = 0; i < idLen; i++) {
                if (i < countryCapacity) {
                    country[i]=(char)uprv_toupper(localeID[i]);
                }
            }
        }
        localeID+=idLen;
    } else {
        idLen = 0;
    }

    if(pEnd!=NULL) {
        *pEnd=localeID;
    }

    return idLen;
}